

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O1

Equality __thiscall capnp::AnyPointer::Reader::equals(Reader *this,Reader right)

{
  Reader right_00;
  Reader right_01;
  PointerType PVar1;
  PointerType PVar2;
  Equality EVar3;
  PointerReader local_d8;
  ListReader local_b0;
  ListReader local_80;
  StructReader local_50;
  
  PVar1 = _::PointerReader::getPointerType(&this->reader);
  PVar2 = _::PointerReader::getPointerType(&right.reader);
  EVar3 = NOT_EQUAL;
  if (PVar1 == PVar2) {
    PVar1 = _::PointerReader::getPointerType(&this->reader);
    switch(PVar1) {
    case NULL_:
      EVar3 = EQUAL;
      break;
    case STRUCT:
      local_d8.segment = (this->reader).segment;
      local_d8.capTable = (this->reader).capTable;
      local_d8.pointer = (this->reader).pointer;
      local_d8.nestingLimit = (this->reader).nestingLimit;
      local_d8._28_4_ = *(undefined4 *)&(this->reader).field_0x1c;
      _::PointerReader::getStruct((StructReader *)&local_b0,&local_d8,(word *)0x0);
      local_d8.pointer = right.reader.pointer;
      local_d8.nestingLimit = right.reader.nestingLimit;
      local_d8._28_4_ = right.reader._28_4_;
      local_d8.segment = right.reader.segment;
      local_d8.capTable = right.reader.capTable;
      _::PointerReader::getStruct(&local_50,&local_d8,(word *)0x0);
      right_01._reader.capTable = local_50.capTable;
      right_01._reader.segment = local_50.segment;
      right_01._reader.data = local_50.data;
      right_01._reader.pointers = local_50.pointers;
      right_01._reader.dataSize = local_50.dataSize;
      right_01._reader.pointerCount = local_50.pointerCount;
      right_01._reader._38_2_ = local_50._38_2_;
      right_01._reader.nestingLimit = local_50.nestingLimit;
      right_01._reader._44_4_ = local_50._44_4_;
      EVar3 = AnyStruct::Reader::equals((Reader *)&local_b0,right_01);
      break;
    case LIST:
      local_d8.segment = (this->reader).segment;
      local_d8.capTable = (this->reader).capTable;
      local_d8.pointer = (this->reader).pointer;
      local_d8.nestingLimit = (this->reader).nestingLimit;
      local_d8._28_4_ = *(undefined4 *)&(this->reader).field_0x1c;
      _::PointerReader::getListAnySize(&local_b0,&local_d8,(word *)0x0);
      local_d8.pointer = right.reader.pointer;
      local_d8.nestingLimit = right.reader.nestingLimit;
      local_d8._28_4_ = right.reader._28_4_;
      local_d8.segment = right.reader.segment;
      local_d8.capTable = right.reader.capTable;
      _::PointerReader::getListAnySize(&local_80,&local_d8,(word *)0x0);
      right_00._reader.capTable = local_80.capTable;
      right_00._reader.segment = local_80.segment;
      right_00._reader.ptr = local_80.ptr;
      right_00._reader.elementCount = local_80.elementCount;
      right_00._reader.step = local_80.step;
      right_00._reader.structDataSize = local_80.structDataSize;
      right_00._reader.structPointerCount = local_80.structPointerCount;
      right_00._reader.elementSize = local_80.elementSize;
      right_00._reader._39_1_ = local_80._39_1_;
      right_00._reader.nestingLimit = local_80.nestingLimit;
      right_00._reader._44_4_ = local_80._44_4_;
      EVar3 = AnyList::Reader::equals((Reader *)&local_b0,right_00);
      break;
    case CAPABILITY:
      EVar3 = UNKNOWN_CONTAINS_CAPS;
      break;
    default:
      kj::_::unreachable();
    }
  }
  return EVar3;
}

Assistant:

Equality AnyPointer::Reader::equals(AnyPointer::Reader right) const {
  if(getPointerType() != right.getPointerType()) {
    return Equality::NOT_EQUAL;
  }
  switch(getPointerType()) {
    case PointerType::NULL_:
      return Equality::EQUAL;
    case PointerType::STRUCT:
      return getAs<AnyStruct>().equals(right.getAs<AnyStruct>());
    case PointerType::LIST:
      return getAs<AnyList>().equals(right.getAs<AnyList>());
    case PointerType::CAPABILITY:
      return Equality::UNKNOWN_CONTAINS_CAPS;
  }
  // There aren't currently any other types of pointers
  KJ_UNREACHABLE;
}